

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O2

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  pointer ppEVar1;
  undefined8 *puVar2;
  AlignmentType AVar3;
  Implementation *pIVar4;
  Node *pNVar5;
  __mxxxi *palVar6;
  pointer ppEVar7;
  Edge *pEVar8;
  bool bVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  Graph *pGVar13;
  uint uVar14;
  int iVar15;
  iterator __begin5;
  long lVar16;
  long lVar17;
  pointer ppEVar18;
  int iVar19;
  undefined4 uVar20;
  long lVar21;
  ulong uVar22;
  __mxxxi *palVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  Node **it;
  pointer ppNVar31;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pvVar32;
  uint uVar33;
  ulong uVar34;
  __mxxxi *palVar35;
  type *ptVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  __mxxxi alVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  backtrack_storage;
  type unpacked [8];
  uint local_18c;
  long local_188;
  type *local_180;
  long local_178;
  uint local_16c;
  ulong local_168;
  ulong local_160;
  Graph *local_158;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_150;
  long local_148;
  undefined1 local_140 [24];
  longlong lStack_128;
  int32_t *local_110;
  ulong local_108;
  pointer local_100;
  uint local_f4;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  pointer local_b0;
  ulong local_a8;
  _Vector_base<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  local_a0;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar38 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar38._0_8_ * 0.125;
  auVar38 = vroundsd_avx(auVar40,auVar40,10);
  local_178 = vcvttsd2usi_avx512f(auVar38);
  uVar14 = 0;
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  uVar25 = 0;
  while ((uVar25 < 8 && (uVar14 < 3))) {
    uVar34 = uVar25 + 1;
    *(undefined4 *)((long)&local_80 + uVar25 * 4) = 0x80000400;
    uVar28 = uVar34 & uVar25;
    uVar25 = uVar34;
    if (uVar28 == 0) {
      uVar34 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
      palVar23 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar34;
      (*palVar23)[0] = local_80;
      (*palVar23)[1] = lStack_78;
      (*palVar23)[2] = lStack_70;
      (*palVar23)[3] = lStack_68;
    }
  }
  palVar23 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar23[3][0] = -0x7ffffc0000000000;
  palVar23[3][1] = -0x7ffffbff7ffffc00;
  palVar23[3][2] = -0x7ffffbff7ffffc00;
  palVar23[3][3] = -0x7ffffbff7ffffc00;
  alVar39 = (__mxxxi)vpbroadcastd_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar39;
  for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
    palVar23 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar43 = *(undefined1 (*) [32])((long)*palVar23 + lVar16);
    auVar43 = vpaddd_avx2(auVar43,auVar43);
    *(undefined1 (*) [32])((long)palVar23[1] + lVar16) = auVar43;
  }
  ppNVar31 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (pointer)(graph->rank_to_node_).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  uVar20 = 0x80000400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    uVar20 = 0;
  }
  uVar34 = (ulong)(sequence_len - 1);
  local_188 = CONCAT44(local_188._4_4_,uVar20);
  local_160 = (ulong)(sequence_len - 1 & 7);
  local_148 = CONCAT44(local_148._4_4_,(int)(this->super_AlignmentEngine).g_);
  local_e0 = vpbroadcastd_avx512vl();
  uVar25 = 0xffffffffffffffff;
  local_f0 = local_e0._16_16_;
  local_158 = graph;
  local_150 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              __return_storage_ptr__;
  local_110 = score;
  local_108 = uVar34;
  for (; this_00 = local_150, (pointer)ppNVar31 != local_100; ppNVar31 = ppNVar31 + 1) {
    pIVar4 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    pNVar5 = *ppNVar31;
    lVar16 = *(long *)&(pIVar4->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar18 = (pNVar5->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppEVar18 ==
        (pNVar5->inedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar34 = 0;
    }
    else {
      uVar34 = (ulong)(*(int *)(lVar16 + (ulong)(*ppEVar18)->tail->id * 4) + 1);
    }
    palVar35 = pIVar4->H;
    lVar17 = (ulong)pNVar5->code * local_178;
    auVar44 = ZEXT464(*(uint *)(*(long *)&(pIVar4->first_column).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               uVar34 * 4));
    palVar6 = pIVar4->sequence_profile;
    uVar14 = *(int *)(lVar16 + (ulong)pNVar5->id * 4) + 1;
    local_180 = (type *)CONCAT44(local_180._4_4_,uVar14);
    lVar21 = uVar34 * local_178;
    lVar24 = 0;
    palVar23 = palVar35 + (ulong)uVar14 * local_178;
    lVar16 = local_178;
    while (bVar37 = lVar16 != 0, lVar16 = lVar16 + -1, bVar37) {
      auVar43 = *(undefined1 (*) [32])((long)palVar35[lVar21] + lVar24);
      auVar42 = vperm2i128_avx2(auVar43,auVar43,0x28);
      auVar43 = vpalignr_avx2(auVar43,auVar42,0xc);
      auVar43 = vpor_avx2(auVar43,auVar44._0_32_);
      auVar38 = *(undefined1 (*) [16])((long)palVar35[lVar21] + lVar24 + 0x10);
      *(undefined1 (*) [32])((long)*palVar23 + lVar24) = auVar43;
      auVar43 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])((long)palVar6[lVar17] + lVar24));
      auVar42 = vpaddd_avx2(local_e0,*(undefined1 (*) [32])((long)palVar35[lVar21] + lVar24));
      auVar41 = vpsrldq_avx2(ZEXT1632(auVar38),0xc);
      auVar44 = ZEXT3264(auVar41);
      auVar43 = vpmaxsd_avx2(auVar43,auVar42);
      *(undefined1 (*) [32])((long)*palVar23 + lVar24) = auVar43;
      lVar24 = lVar24 + 0x20;
    }
    for (uVar34 = 1;
        ppEVar18 = ((*ppNVar31)->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
        uVar34 < (ulong)((long)((*ppNVar31)->inedges).
                               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar18 >> 3);
        uVar34 = (ulong)((int)uVar34 + 1)) {
      pIVar4 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      uVar28 = (ulong)(*(int *)(*(long *)&(pIVar4->node_id_to_rank).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               + (ulong)ppEVar18[uVar34]->tail->id * 4) + 1);
      auVar44 = ZEXT464(*(uint *)(*(long *)&(pIVar4->first_column).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                 uVar28 * 4));
      lVar21 = uVar28 * local_178;
      palVar35 = pIVar4->H;
      lVar24 = 0;
      lVar16 = local_178;
      while (bVar37 = lVar16 != 0, lVar16 = lVar16 + -1, bVar37) {
        auVar43 = *(undefined1 (*) [32])((long)palVar35[lVar21] + lVar24);
        auVar42 = vperm2i128_avx2(auVar43,auVar43,0x28);
        auVar42 = vpalignr_avx2(auVar43,auVar42,0xc);
        auVar43 = vpaddd_avx2(auVar43,local_e0);
        auVar42 = vpor_avx2(auVar42,auVar44._0_32_);
        auVar42 = vpaddd_avx2(auVar42,*(undefined1 (*) [32])((long)palVar6[lVar17] + lVar24));
        auVar43 = vpmaxsd_avx2(auVar42,auVar43);
        auVar43 = vpmaxsd_avx2(auVar43,*(undefined1 (*) [32])((long)*palVar23 + lVar24));
        auVar42 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                         ((long)palVar35[lVar21] + lVar24 + 0x10)),0xc);
        auVar44 = ZEXT3264(auVar42);
        *(undefined1 (*) [32])((long)*palVar23 + lVar24) = auVar43;
        lVar24 = lVar24 + 0x20;
      }
    }
    local_140._8_8_ = 0x8000040080000400;
    local_140._0_8_ = 0x8000040080000400;
    local_140._16_8_ = (pointer)0x8000040080000400;
    lStack_128 = -0x7ffffbff7ffffc00;
    auVar38 = vpbroadcastd_avx512vl();
    auVar44 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),auVar38._0_4_));
    lVar16 = local_178;
    palVar35 = palVar23;
    local_168 = uVar25;
    while (uVar34 = local_108, ptVar36 = (type *)local_168, bVar37 = lVar16 != 0,
          lVar16 = lVar16 + -1, bVar37) {
      auVar43 = vorps_avx(auVar44._0_32_,
                          (undefined1  [32])
                          ((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->masks[3]);
      alVar39 = (__mxxxi)vpmaxsd_avx2(auVar43,(undefined1  [32])*palVar35);
      *palVar35 = alVar39;
      pIVar4 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_prefix_max
                (palVar35,pIVar4->masks,pIVar4->penalties);
      alVar39 = *palVar35;
      auVar38 = vpaddd_avx(local_f0,*(undefined1 (*) [16])(*palVar35 + 2));
      if ((this->super_AlignmentEngine).type_ == kSW) {
        alVar39 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar39,_DAT_00118000);
        *palVar35 = alVar39;
      }
      _local_140 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar39,(undefined1  [32])_local_140);
      auVar43 = vpsrldq_avx2(ZEXT1632(auVar38),0xc);
      auVar44 = ZEXT3264(auVar43);
      palVar35 = palVar35 + 1;
    }
    AVar3 = (this->super_AlignmentEngine).type_;
    if (AVar3 == kSW) {
      iVar15 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                         ((__mxxxi *)local_140);
      uVar34 = local_108;
      ptVar36 = (type *)local_168;
LAB_0010c8d4:
      if ((int)local_188 < iVar15) {
        ptVar36 = local_180;
      }
      iVar19 = (int)local_188;
      if ((int)local_188 <= iVar15) {
        iVar19 = iVar15;
      }
      local_188 = CONCAT44(local_188._4_4_,iVar19);
      uVar25 = (ulong)ptVar36 & 0xffffffff;
    }
    else {
      uVar25 = local_168;
      if (AVar3 == kNW) {
        if (((*ppNVar31)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ((*ppNVar31)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          palVar23 = palVar23 + local_178 + -1;
          local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(*palVar23)[0];
          local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(*palVar23)[1];
          local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*palVar23)[2];
          lStack_88 = (*palVar23)[3];
          iVar15 = *(int *)((long)&local_a0._M_impl.super__Vector_impl_data._M_start + local_160 * 4
                           );
          goto LAB_0010c8d4;
        }
      }
      else if ((AVar3 == kOV) &&
              (((*ppNVar31)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start ==
               ((*ppNVar31)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish)) {
        iVar15 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                           ((__mxxxi *)local_140);
        goto LAB_0010c8d4;
      }
    }
  }
  iVar15 = (int)uVar25;
  if (iVar15 == -1) {
    *(pointer *)(local_150 + 0x10) = (pointer)0x0;
    *(undefined1 (*) [16])local_150 = (undefined1  [16])0x0;
    return (Alignment *)local_150;
  }
  if (local_110 != (int32_t *)0x0) {
    *local_110 = (int)local_188;
  }
  AVar3 = (this->super_AlignmentEngine).type_;
  if (AVar3 == kOV) {
    pNVar5 = (local_158->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar15 + -1];
    if ((pNVar5->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pNVar5->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl + 8)) goto LAB_0010c987;
  }
  else {
    if (AVar3 == kNW) goto LAB_0010c987;
    if (AVar3 != kSW) {
      uVar34 = 0xffffffffffffffff;
      goto LAB_0010c987;
    }
  }
  uVar14 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                     (((this->pimpl_)._M_t.
                       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       .
                       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl)->H + iVar15 * local_178,(uint32_t)local_178,(int)local_188);
  uVar34 = (ulong)uVar14;
LAB_0010c987:
  uVar28 = 1;
  for (uVar22 = 0; uVar14 = (uint)uVar28, (uVar25 & 0xffffffff) != uVar22; uVar22 = uVar22 + 1) {
    pNVar5 = (local_158->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar22];
    uVar27 = (ulong)((long)*(pointer *)
                            ((long)&(pNVar5->inedges).
                                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                    ._M_impl + 8) -
                    *(long *)&(pNVar5->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl.super__Vector_impl_data) >> 3;
    if ((uint)uVar27 < uVar14) {
      uVar27 = uVar28;
    }
    uVar28 = uVar27 & 0xffffffff;
  }
  std::
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
            *)&local_a0,(ulong)(uVar14 * 0x10 + 0x18),(allocator_type *)local_140);
  *(pointer *)(this_00 + 0x10) = (pointer)0x0;
  local_160 = 0;
  uVar29 = 0;
  *(undefined1 (*) [16])this_00 = (undefined1  [16])0x0;
  local_100 = local_a0._M_impl.super__Vector_impl_data._M_start + 1;
  local_e0._0_8_ = local_a0._M_impl.super__Vector_impl_data._M_start;
  local_f0._0_8_ = local_a0._M_impl.super__Vector_impl_data._M_start[1].arr + (uVar14 << 3);
  local_180 = local_a0._M_impl.super__Vector_impl_data._M_start[1].arr + (uVar14 << 3) +
              (uVar14 << 3);
  local_140._16_8_ = 0;
  _local_140 = (__mxxxi)(ZEXT1632(stack0xfffffffffffffed0) << 0x80);
  bVar37 = true;
  local_168 = uVar25;
  local_16c = (uint)uVar34;
  while( true ) {
    iVar15 = (int)local_168;
    pvVar32 = this_00;
    if (((int)uVar34 == -1) || (iVar15 == 0)) break;
    local_110 = (int32_t *)CONCAT44(local_110._4_4_,uVar29);
    uVar25 = uVar34 >> 3 & 0x1fffffff;
    local_148 = (long)(iVar15 + -1);
    local_188 = (long)iVar15;
    if (bVar37) {
      if (local_140._8_8_ != local_140._0_8_) {
        local_140._8_8_ = local_140._0_8_;
      }
      local_b0 = (local_158->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      palVar23 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->H + local_188 * local_178 + uVar25;
      lVar10 = (*palVar23)[1];
      lVar11 = (*palVar23)[2];
      lVar12 = (*palVar23)[3];
      *(longlong *)local_e0._0_8_ = (*palVar23)[0];
      *(longlong *)(local_e0._0_8_ + 8) = lVar10;
      *(longlong *)(local_e0._0_8_ + 0x10) = lVar11;
      *(longlong *)(local_e0._0_8_ + 0x18) = lVar12;
      ppEVar18 = (local_b0[local_148]->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = *(pointer *)
                 ((long)&(local_b0[local_148]->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      local_108 = uVar34;
      local_a8 = uVar25;
      if (ppEVar18 == ppEVar7) {
        local_18c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,
                   (int *)&local_18c);
        palVar23 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H + uVar25;
        lVar10 = (*palVar23)[1];
        lVar11 = (*palVar23)[2];
        lVar12 = (*palVar23)[3];
        *(longlong *)local_100->arr = (*palVar23)[0];
        *(longlong *)(local_100->arr + 2) = lVar10;
        *(longlong *)(local_100->arr + 4) = lVar11;
        *(longlong *)(local_100->arr + 6) = lVar12;
      }
      else {
        for (uVar34 = 0; ppEVar1 = (pointer)((long)ppEVar18 + uVar34), ppEVar1 != ppEVar7;
            uVar34 = uVar34 + 8) {
          local_18c = *(int *)(*(long *)&(((this->pimpl_)._M_t.
                                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                           .
                                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                                          ._M_head_impl)->node_id_to_rank).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              + (ulong)(*ppEVar1)->tail->id * 4) + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,&local_18c);
          palVar23 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H + (ulong)*(uint *)(local_140._8_8_ + -4) * local_178 + uVar25
          ;
          lVar10 = (*palVar23)[1];
          lVar11 = (*palVar23)[2];
          lVar12 = (*palVar23)[3];
          ptVar36 = local_100->arr + (uVar34 & 0xffffffff);
          *(longlong *)ptVar36 = (*palVar23)[0];
          *(longlong *)(ptVar36 + 2) = lVar10;
          *(longlong *)(ptVar36 + 4) = lVar11;
          *(longlong *)(ptVar36 + 6) = lVar12;
        }
      }
      palVar23 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->sequence_profile +
                 (ulong)local_b0[local_148]->code * local_178 + uVar25;
      lVar10 = (*palVar23)[1];
      lVar11 = (*palVar23)[2];
      lVar12 = (*palVar23)[3];
      *(longlong *)(local_180 + 8) = (*palVar23)[0];
      *(longlong *)(local_180 + 10) = lVar10;
      *(longlong *)(local_180 + 0xc) = lVar11;
      *(longlong *)(local_180 + 0xe) = lVar12;
      uVar25 = local_a8;
      pvVar32 = local_150;
      uVar34 = local_108;
    }
    this_00 = local_150;
    uVar33 = (uint)uVar34;
    uVar14 = uVar33 & 7;
    if (((this->super_AlignmentEngine).type_ == kSW) &&
       (*(int *)(local_e0._0_8_ + (ulong)uVar14 * 4) == 0)) goto LAB_0010cf8c;
    if ((uVar34 & 7) == 0) {
      pIVar4 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      if (uVar33 < 8) {
        lVar16 = *(long *)&(pIVar4->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        local_180[7] = *(type *)(lVar16 + local_188 * 4);
        uVar29 = 7;
        for (uVar30 = 0; (ulong)uVar30 < (ulong)((long)(local_140._8_8_ - local_140._0_8_) >> 2);
            uVar30 = uVar30 + 1) {
          uVar25 = (ulong)uVar29;
          uVar29 = uVar29 + 8;
          *(undefined4 *)(local_f0._0_8_ + uVar25 * 4) =
               *(undefined4 *)(lVar16 + (ulong)*(uint *)(local_140._0_8_ + (ulong)uVar30 * 4) * 4);
        }
      }
      else {
        palVar23 = pIVar4->H + local_188 * local_178 + (uVar25 - 1);
        lVar10 = *(longlong *)((long)*palVar23 + 8);
        lVar11 = *(longlong *)((long)*palVar23 + 0x10);
        lVar12 = *(longlong *)((long)*palVar23 + 0x18);
        *(longlong *)local_180 = (*palVar23)[0];
        *(longlong *)(local_180 + 2) = lVar10;
        *(longlong *)(local_180 + 4) = lVar11;
        *(longlong *)(local_180 + 6) = lVar12;
        uVar28 = 0;
        for (uVar29 = 0; (ulong)uVar29 < (ulong)((long)(local_140._8_8_ - local_140._0_8_) >> 2);
            uVar29 = uVar29 + 1) {
          palVar23 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H +
                     (ulong)*(uint *)(local_140._0_8_ + (ulong)uVar29 * 4) * local_178 +
                     (uVar25 - 1);
          lVar10 = *(longlong *)((long)*palVar23 + 8);
          lVar11 = *(longlong *)((long)*palVar23 + 0x10);
          lVar12 = *(longlong *)((long)*palVar23 + 0x18);
          puVar2 = (undefined8 *)(local_f0._0_8_ + uVar28 * 4);
          *puVar2 = (*palVar23)[0];
          puVar2[1] = lVar10;
          puVar2[2] = lVar11;
          puVar2[3] = lVar12;
          uVar28 = (ulong)((int)uVar28 + 8);
        }
      }
    }
    uVar29 = uVar14 - 1;
    uVar26 = 0;
    uVar25 = (long)(local_140._8_8_ - local_140._0_8_) >> 2;
    uVar30 = 7;
    while( true ) {
      if (uVar25 <= uVar26) break;
      if ((uVar34 & 7) == 0) {
        if (*(int *)local_e0._0_8_ == local_180[8] + *(int *)(local_f0._0_8_ + (ulong)uVar30 * 4))
        goto LAB_0010ccd4;
      }
      else if (*(int *)(local_e0._0_8_ + (ulong)(uVar14 * 4)) ==
               *(int *)((long)local_180 + (ulong)(uVar14 * 4) + 0x20) +
               *(int *)(local_e0._0_8_ + ((ulong)uVar29 + 8) * 4)) {
LAB_0010ccd4:
        uVar25 = (ulong)*(uint *)(local_140._0_8_ + (ulong)uVar26 * 4);
        uVar29 = uVar33 - 1;
        goto LAB_0010ce0c;
      }
      uVar26 = uVar26 + 1;
      uVar29 = uVar29 + 8;
      uVar30 = uVar30 + 8;
    }
    iVar15 = (int)(this->super_AlignmentEngine).g_;
    uVar28 = 0;
    uVar29 = uVar14;
    do {
      uVar27 = uVar28;
      uVar22 = (ulong)uVar29;
      if (uVar25 <= uVar27) {
        if ((uVar34 & 7) == 0) {
          bVar37 = *(int *)local_e0._0_8_ == iVar15 + local_180[7];
        }
        else {
          bVar37 = *(int *)(local_e0._0_8_ + (ulong)uVar14 * 4) ==
                   iVar15 + *(int *)(local_e0._0_8_ + ((ulong)uVar14 - 1) * 4);
        }
        uVar25 = local_160;
        uVar29 = (uint)local_110;
        if (!bVar37) goto LAB_0010ce0c;
        uVar29 = uVar33 - 1;
        goto LAB_0010ce1c;
      }
      uVar29 = uVar29 + 8;
      uVar28 = (ulong)((int)uVar27 + 1);
    } while (*(int *)(local_e0._0_8_ + (ulong)uVar14 * 4) !=
             *(int *)(local_e0._0_8_ + (uVar22 + 8) * 4) + iVar15);
    uVar25 = (ulong)*(uint *)(local_140._0_8_ + uVar27 * 4);
    uVar29 = uVar33;
LAB_0010ce0c:
    bVar37 = (int)local_168 == (int)uVar25;
    local_168 = uVar25;
    if (bVar37) {
LAB_0010ce1c:
      local_18c = 0xffffffff;
      bVar9 = true;
    }
    else {
      bVar9 = false;
      local_18c = (local_158->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_148]->id;
    }
    local_f4 = uVar33;
    if (uVar33 == uVar29) {
      local_f4 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,int>(local_150,&local_18c,(int *)&local_f4);
    bVar37 = true;
    if (bVar9) {
      bVar37 = (~uVar29 & 7) == 0 && uVar33 != uVar29;
    }
    uVar34 = (ulong)uVar29;
    local_160 = local_168 & 0xffffffff;
    local_16c = uVar29;
  }
  if ((this->super_AlignmentEngine).type_ == kNW) {
    uVar25 = local_168;
    if ((iVar15 == 0) && ((int)uVar34 != -1)) {
      uVar34 = 0xffffffffffffffff;
      do {
        local_18c = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (this_00,(int *)&local_18c,(int *)&local_16c);
        bVar37 = local_16c != 0;
        local_16c = local_16c - 1;
        uVar25 = local_168;
      } while (bVar37);
    }
    while ((pGVar13 = local_158, uVar14 = (uint)uVar25, uVar14 != 0 && ((int)uVar34 == -1))) {
      lVar16 = (long)(int)uVar14;
      local_18c = 0xffffffff;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,int>
                (this_00,&(local_158->rank_to_node_).
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar16 + -1]->id,
                 (int *)&local_18c);
      pNVar5 = (pGVar13->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar16 + -1];
      ppEVar18 = (pNVar5->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = *(pointer *)
                 ((long)&(pNVar5->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar18 == ppEVar7) {
        uVar29 = 0;
      }
      else {
        pIVar4 = (this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 .
                 super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl;
        do {
          uVar29 = uVar14;
          if (ppEVar18 == ppEVar7) break;
          pEVar8 = *ppEVar18;
          lVar17 = *(long *)&(pIVar4->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          ppEVar18 = ppEVar18 + 1;
          uVar29 = *(int *)(*(long *)&(pIVar4->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)pEVar8->tail->id * 4) + 1;
        } while (*(int *)(lVar17 + lVar16 * 4) !=
                 *(int *)(lVar17 + (ulong)uVar29 * 4) + (int)(this->super_AlignmentEngine).g_);
      }
      uVar25 = (ulong)uVar29;
      uVar34 = (ulong)local_16c;
    }
  }
LAB_0010cf8c:
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (*(undefined8 *)pvVar32,*(pointer *)(pvVar32 + 8));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_140);
  std::
  _Vector_base<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  ::~_Vector_base(&local_a0);
  return (Alignment *)pvVar32;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}